

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O0

Optional<llvm::dwarf::Tag> __thiscall llvm::AppleAcceleratorTable::Entry::getTag(Entry *this)

{
  bool bVar1;
  DWARFFormValue *this_00;
  unsigned_long *puVar2;
  Optional<unsigned_long> OVar3;
  Tag local_62;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_60;
  Optional<unsigned_long> Value;
  Optional<llvm::DWARFFormValue> Tag;
  Entry *this_local;
  
  lookup((Optional<llvm::DWARFFormValue> *)&Value.Storage.hasVal,this,3);
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&Value.Storage.hasVal);
  if (bVar1) {
    this_00 = Optional<llvm::DWARFFormValue>::operator->
                        ((Optional<llvm::DWARFFormValue> *)&Value.Storage.hasVal);
    OVar3 = DWARFFormValue::getAsUnsignedConstant(this_00);
    local_60 = OVar3.Storage.field_0;
    Value.Storage.field_0.empty = OVar3.Storage.hasVal;
    bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&local_60.empty);
    if (bVar1) {
      puVar2 = Optional<unsigned_long>::operator*((Optional<unsigned_long> *)&local_60);
      local_62 = (Tag)*puVar2;
      Optional<llvm::dwarf::Tag>::Optional
                ((Optional<llvm::dwarf::Tag> *)((long)&this_local + 4),&local_62);
    }
    else {
      Optional<llvm::dwarf::Tag>::Optional
                ((Optional<llvm::dwarf::Tag> *)((long)&this_local + 4),None);
    }
  }
  else {
    Optional<llvm::dwarf::Tag>::Optional((Optional<llvm::dwarf::Tag> *)((long)&this_local + 4),None)
    ;
  }
  return (Optional<llvm::dwarf::Tag>)this_local._4_4_;
}

Assistant:

Optional<dwarf::Tag> AppleAcceleratorTable::Entry::getTag() const {
  Optional<DWARFFormValue> Tag = lookup(dwarf::DW_ATOM_die_tag);
  if (!Tag)
    return None;
  if (Optional<uint64_t> Value = Tag->getAsUnsignedConstant())
    return dwarf::Tag(*Value);
  return None;
}